

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

void __thiscall flow::BasicBlock::~BasicBlock(BasicBlock *this)

{
  pointer ppBVar1;
  FILE *__stream;
  pointer ppBVar2;
  allocator<char> local_59;
  undefined1 local_58 [40];
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__BasicBlock_001af548;
  while (__stream = _stderr,
        (this->code_).
        super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->code_).
        super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    remove((BasicBlock *)local_58,(char *)this);
    if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
    }
    local_58._0_8_ = (_func_int **)0x0;
  }
  if ((this->predecessors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->predecessors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppBVar1 = (this->successors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar2 = (this->successors_).
                   super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1;
        ppBVar2 = ppBVar2 + 1) {
      unlinkSuccessor(this,*ppBVar2);
    }
    std::_Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~_Vector_base
              (&(this->successors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>);
    std::_Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~_Vector_base
              (&(this->predecessors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>);
    std::
    vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
    ::~vector(&this->code_);
    Value::~Value(&this->super_Value);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),
             "Cannot remove a BasicBlock that another BasicBlock still refers to.",&local_59);
  fprintf(__stream,"%s\n",local_58._8_8_);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  abort();
}

Assistant:

BasicBlock::~BasicBlock() {
  // XXX we *must* destruct the code in reverse order to ensure proper release
  // The validity checks will fail otherwise.
  while (!empty()) {
    remove(back());
  }

  FLOW_ASSERT(predecessors_.empty(),
              "Cannot remove a BasicBlock that another BasicBlock still refers to.");

  for (BasicBlock* bb : predecessors_) {
    bb->unlinkSuccessor(this);
  }

  for (BasicBlock* bb : successors_) {
    unlinkSuccessor(bb);
  }
}